

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonConvert.h
# Opt level: O2

void __thiscall
Json::JsonConvert::JsonConvert
          (JsonConvert *this,JsonParser *jsonParser,bool format,int indent,bool escape)

{
  (this->__lstJsonValue).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->jsonValuePtr).super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->__lstJsonValue).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->__lstJsonValue).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->jsonValuePtr).super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->__format = format;
  this->__ptr = 0;
  this->__indent = indent;
  jsonParser->__escape = escape;
  if (jsonParser->__parser == false) {
    JsonParser::parseJsonDocument(jsonParser);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->__lstJsonValue,&jsonParser->jsonValue);
  this->__len = (int)((ulong)((long)(this->__lstJsonValue).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->__lstJsonValue).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
  return;
}

Assistant:

explicit JsonConvert(const JsonParser &jsonParser, bool format = false, int indent = 4, bool escape = false)
                : __format(format), __ptr(0), __indent(indent) {
            jsonParser.__escape = escape;
            if (!jsonParser.__parser) const_cast<JsonParser &>(jsonParser).parseJsonDocument();
            __lstJsonValue = jsonParser.jsonValue;
            __len = __lstJsonValue.size();
        }